

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O1

unique_pointer<const_pstore::uint128> __thiscall
pstore::database::getrou<pstore::uint128,void>
          (database *this,typed_address<pstore::uint128> addr,size_t elements)

{
  long in_RCX;
  _Head_base<0UL,_const_pstore::uint128_*,_false> extraout_RDX;
  unique_pointer<const_pstore::uint128> uVar1;
  _func_int **local_20;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Stack_18;
  
  if ((elements & 0xf) == 0) {
    (**(code **)(*(long *)addr.a_.a_ + 0x18))(&local_20,addr.a_.a_,elements,in_RCX << 4,1);
    this->_vptr_database = local_20;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         _Stack_18._M_head_impl;
    uVar1._M_t.super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t.
    super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>.
    super__Head_base<0UL,_const_pstore::uint128_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
    uVar1._M_t.super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t.
    super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>.
    super__Tuple_impl<1UL,_void_(*)(const_pstore::uint128_*)>.
    super__Head_base<1UL,_void_(*)(const_pstore::uint128_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(const_pstore::uint128_*),_false>)
         (_Head_base<1UL,_void_(*)(const_pstore::uint128_*),_false>)this;
    return (unique_pointer<const_pstore::uint128>)
           uVar1._M_t.
           super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t.
           super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>;
  }
  raise<pstore::error_code>(bad_alignment);
}

Assistant:

auto database::getrou (typed_address<T> const addr, std::size_t const elements) const
        -> unique_pointer<T const> {
        if (addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        return unique_pointer_cast<T const> (
            this->getrou (addr.to_address (), sizeof (T) * elements));
    }